

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O2

void SL::WS_LITE::
     ProcessControlMessage<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
               (shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,shared_ptr<unsigned_char> *buffer,size_t size,
               shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *extradata)

{
  element_type *peVar1;
  element_type *peVar2;
  byte bVar3;
  allocator<char> local_51;
  string local_50;
  
  peVar1 = (socket->
           super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if ((char)peVar1->ReceiveHeader[0] < '\0') {
    bVar3 = peVar1->ReceiveHeader[0] & 0xf;
    if (bVar3 == 8) {
      ProcessClose<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
                (socket,buffer,size);
      return;
    }
    if (bVar3 == 10) {
      peVar2 = (peVar1->Parent).
               super___shared_ptr<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2->onPong).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::__shared_ptr<SL::WS_LITE::IWebSocket,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>,void>
                  ((__shared_ptr<SL::WS_LITE::IWebSocket,(__gnu_cxx::_Lock_policy)2> *)&local_50,
                   &socket->
                    super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
        std::
        function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_unsigned_char_*,_unsigned_long)>
        ::operator()(&peVar2->onPong,(shared_ptr<SL::WS_LITE::IWebSocket> *)&local_50,
                     (buffer->super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     size);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
      }
    }
    else {
      if (bVar3 != 9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Closing connection. nonvalid op code",&local_51);
        sendclosemessage<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
                  (socket,0x3ea,&local_50);
        goto LAB_00122468;
      }
      peVar2 = (peVar1->Parent).
               super___shared_ptr<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2->onPing).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::__shared_ptr<SL::WS_LITE::IWebSocket,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>,void>
                  ((__shared_ptr<SL::WS_LITE::IWebSocket,(__gnu_cxx::_Lock_policy)2> *)&local_50,
                   &socket->
                    super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
        std::
        function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_unsigned_char_*,_unsigned_long)>
        ::operator()(&peVar2->onPing,(shared_ptr<SL::WS_LITE::IWebSocket> *)&local_50,
                     (buffer->super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     size);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
      }
      SendPong<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
                (socket,buffer,size);
    }
    ReadHeaderNext<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
              (socket,extradata);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Closing connection. Control Frames must be Fin",&local_51);
    sendclosemessage<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
              (socket,0x3ea,&local_50);
LAB_00122468:
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

inline void ProcessControlMessage(const SOCKETTYPE &socket, const std::shared_ptr<unsigned char> &buffer, size_t size,
                                      const std::shared_ptr<asio::streambuf> &extradata)
    {
        if (!getFin(socket->ReceiveHeader)) {
            return sendclosemessage<isServer>(socket, 1002, "Closing connection. Control Frames must be Fin");
        }
        auto opcode = static_cast<OpCode>(getOpCode(socket->ReceiveHeader));

        switch (opcode) {
        case OpCode::PING:
            if (socket->Parent->onPing) {
                socket->Parent->onPing(socket, buffer.get(), size);
            }
            SendPong<isServer>(socket, buffer, size);
            break;
        case OpCode::PONG:
            if (socket->Parent->onPong) {
                socket->Parent->onPong(socket, buffer.get(), size);
            }
            break;
        case OpCode::CLOSE:
            return ProcessClose<isServer>(socket, buffer, size);

        default:
            return sendclosemessage<isServer>(socket, 1002, "Closing connection. nonvalid op code");
        }
        ReadHeaderNext<isServer>(socket, extradata);
    }